

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_> *
testing::Truly<(anonymous_namespace)::first_elements_are>
          (PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_>
           *__return_storage_ptr__,first_elements_are *pred)

{
  TrulyMatcher<(anonymous_namespace)::first_elements_are> *impl;
  first_elements_are local_58;
  TrulyMatcher<(anonymous_namespace)::first_elements_are> local_38;
  first_elements_are *local_18;
  first_elements_are *pred_local;
  
  local_18 = pred;
  pred_local = (first_elements_are *)__return_storage_ptr__;
  anon_unknown.dwarf_131826::first_elements_are::first_elements_are(&local_58,pred);
  internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>::TrulyMatcher
            (&local_38,&local_58);
  MakePolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>>
            (__return_storage_ptr__,(testing *)&local_38,impl);
  internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>::~TrulyMatcher(&local_38);
  anon_unknown.dwarf_131826::first_elements_are::~first_elements_are(&local_58);
  return __return_storage_ptr__;
}

Assistant:

inline PolymorphicMatcher<internal::TrulyMatcher<Predicate> >
Truly(Predicate pred) {
  return MakePolymorphicMatcher(internal::TrulyMatcher<Predicate>(pred));
}